

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flush-recognizer.cpp
# Opt level: O1

void __thiscall mahjong::FlushRecognizer::check(FlushRecognizer *this,Meld *meld)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  Tile TVar4;
  long lVar5;
  
  bVar3 = Meld::isHonors(meld);
  if (bVar3) {
    this->has_honors = true;
  }
  else {
    TVar4 = Meld::frontTile(meld);
    (this->has_suit_tiles)._M_elems[(long)((int)TVar4 / 100) + -1] = true;
    bVar3 = Meld::isSequence(meld);
    lVar5 = (long)(((int)TVar4 / 10) % 10);
    iVar2 = *(int *)((long)&this->has_suit_tiles + lVar5 * 4 + -1);
    if (bVar3) {
      *(int *)((long)&this->has_suit_tiles + lVar5 * 4 + -1) = iVar2 + 1;
      piVar1 = (this->number_count)._M_elems + lVar5;
      *piVar1 = *piVar1 + 1;
      piVar1 = (this->number_count)._M_elems + lVar5 + 1;
      *piVar1 = *piVar1 + 1;
    }
    else {
      *(int *)((long)&this->has_suit_tiles + lVar5 * 4 + -1) = iVar2 + 3;
      bVar3 = Meld::isQuad(meld);
      if (bVar3) {
        piVar1 = (int *)((long)&this->has_suit_tiles + lVar5 * 4 + -1);
        *piVar1 = *piVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void FlushRecognizer::check(const Meld& meld)
{
	if (meld.isHonors())
	{
		has_honors = true;
	}
	else
	{
		auto code = static_cast<int>(meld.frontTile());
		auto suit = code / 100;
		auto number = code / 10 % 10;

		has_suit_tiles[suit - 1] = true;

		if (meld.isSequence())
		{
			number_count[number - 1 + 0]++;
			number_count[number - 1 + 1]++;
			number_count[number - 1 + 2]++;
		}
		else
		{
			number_count[number - 1] += 3;
			if (meld.isQuad()) number_count[number - 1]++;
		}
	}
}